

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O3

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::MultiplyAndAdd
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this,
          double *result,ChVectorDynamic<double> *vect)

{
  double *pdVar1;
  long lVar2;
  
  if (this->variables_1->disabled == false) {
    lVar2 = (long)this->variables_1->offset;
    if ((lVar2 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar2)) goto LAB_0055b698;
    pdVar1 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar1[lVar2] +
              (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar1[lVar2 + 2] +
              (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar1[lVar2 + 4] +
              (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar1 + lVar2)[1] +
              (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar1 + lVar2 + 2)[1] +
              (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar1 + lVar2 + 4)[1] + *result;
  }
  if (this->variables_2->disabled == false) {
    lVar2 = (long)this->variables_2->offset;
    if ((lVar2 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar2)) goto LAB_0055b698;
    pdVar1 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar1[lVar2] +
              (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar1[lVar2 + 2] +
              (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar1[lVar2 + 4] +
              (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar1 + lVar2)[1] +
              (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar1 + lVar2 + 2)[1] +
              (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar1 + lVar2 + 4)[1] + *result;
  }
  if (this->variables_3->disabled == false) {
    lVar2 = (long)this->variables_3->offset;
    if ((lVar2 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar2)) {
LAB_0055b698:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar1 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar1[lVar2] +
              (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar1[lVar2 + 2] +
              (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar1[lVar2 + 4] +
              (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar1 + lVar2)[1] +
              (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar1 + lVar2 + 2)[1] +
              (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar1 + lVar2 + 4)[1] + *result;
  }
  return;
}

Assistant:

void MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
        if (variables_1->IsActive()) {
            result += Cq_1 * vect.segment(variables_1->GetOffset(), T::nvars1);
        }

        if (variables_2->IsActive()) {
            result += Cq_2 * vect.segment(variables_2->GetOffset(), T::nvars2);
        }

        if (variables_3->IsActive()) {
            result += Cq_3 * vect.segment(variables_3->GetOffset(), T::nvars3);
        }
    }